

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O1

void jinit_color_deconverter(j_decompress_ptr cinfo)

{
  J_COLOR_SPACE JVar1;
  jpeg_component_info *pjVar2;
  jpeg_error_mgr *pjVar3;
  int iVar4;
  jpeg_color_deconverter *pjVar5;
  _func_void_j_decompress_ptr *p_Var6;
  code *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  pjVar5 = (jpeg_color_deconverter *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x38);
  cinfo->cconvert = pjVar5;
  pjVar5->start_pass = start_pass_dcolor;
  JVar1 = cinfo->jpeg_color_space;
  if (JVar1 - JCS_RGB < 2) {
    if (cinfo->num_components != 3) goto LAB_00283564;
  }
  else if (JVar1 - JCS_CMYK < 2) {
    if (cinfo->num_components != 4) goto LAB_00283564;
  }
  else if (JVar1 == JCS_GRAYSCALE) {
    if (cinfo->num_components != 1) {
LAB_00283564:
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0xb;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
    }
  }
  else if (cinfo->num_components < 1) goto LAB_00283564;
  JVar1 = cinfo->out_color_space;
  if (JVar1 == JCS_CMYK) {
    cinfo->out_color_components = 4;
    if (cinfo->jpeg_color_space == JCS_CMYK) {
LAB_00283673:
      pcVar7 = null_convert;
      goto LAB_002836ac;
    }
    if (cinfo->jpeg_color_space == JCS_YCCK) {
      pcVar7 = ycck_cmyk_convert;
LAB_00283657:
      pjVar5->color_convert = pcVar7;
      build_ycc_rgb_table(cinfo);
      goto LAB_002836b0;
    }
  }
  else {
    if (JVar1 == JCS_RGB) {
      cinfo->out_color_components = 3;
      JVar1 = cinfo->jpeg_color_space;
      if (JVar1 == JCS_GRAYSCALE) {
        pcVar7 = gray_rgb_convert;
      }
      else {
        if (JVar1 != JCS_RGB) {
          if (JVar1 == JCS_YCbCr) {
            pcVar7 = ycc_rgb_convert;
            goto LAB_00283657;
          }
          goto LAB_0028367c;
        }
        pcVar7 = rgb_convert;
      }
LAB_002836ac:
      pjVar5->color_convert = pcVar7;
      goto LAB_002836b0;
    }
    if (JVar1 == JCS_GRAYSCALE) {
      cinfo->out_color_components = 1;
      JVar1 = cinfo->jpeg_color_space;
      if (JVar1 != JCS_YCbCr) {
        if (JVar1 == JCS_RGB) {
          pjVar5->color_convert = rgb_gray_convert;
          pjVar5 = cinfo->cconvert;
          p_Var6 = (_func_void_j_decompress_ptr *)
                   (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x1800);
          pjVar5[3].start_pass = p_Var6;
          pcVar7 = p_Var6 + 0x1000;
          lVar8 = 0x8000;
          lVar9 = 0;
          lVar10 = 0;
          do {
            *(long *)(pcVar7 + -0x1000) = lVar9;
            *(long *)(pcVar7 + -0x800) = lVar10;
            *(long *)pcVar7 = lVar8;
            lVar8 = lVar8 + 0x1d2f;
            pcVar7 = pcVar7 + 8;
            lVar10 = lVar10 + 0x9646;
            lVar9 = lVar9 + 0x4c8b;
          } while (lVar8 != 0x1daf00);
          goto LAB_002836b0;
        }
        if (JVar1 != JCS_GRAYSCALE) goto LAB_0028367c;
      }
      pjVar5->color_convert = grayscale_convert;
      iVar4 = cinfo->num_components;
      if (1 < (long)iVar4) {
        pjVar2 = cinfo->comp_info;
        lVar8 = 0;
        do {
          *(undefined4 *)((long)&pjVar2[1].component_needed + lVar8) = 0;
          lVar8 = lVar8 + 0x60;
        } while ((long)iVar4 * 0x60 + -0x60 != lVar8);
      }
      goto LAB_002836b0;
    }
    if (JVar1 == cinfo->jpeg_color_space) {
      cinfo->out_color_components = cinfo->num_components;
      goto LAB_00283673;
    }
  }
LAB_0028367c:
  pjVar3 = cinfo->err;
  pjVar3->msg_code = 0x1c;
  (*pjVar3->error_exit)((j_common_ptr)cinfo);
LAB_002836b0:
  iVar4 = 1;
  if (cinfo->quantize_colors == 0) {
    iVar4 = cinfo->out_color_components;
  }
  cinfo->output_components = iVar4;
  return;
}

Assistant:

GLOBAL(void)
jinit_color_deconverter (j_decompress_ptr cinfo)
{
  my_cconvert_ptr cconvert;
  int ci;

  cconvert = (my_cconvert_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_color_deconverter));
  cinfo->cconvert = (struct jpeg_color_deconverter *) cconvert;
  cconvert->pub.start_pass = start_pass_dcolor;

  /* Make sure num_components agrees with jpeg_color_space */
  switch (cinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->num_components != 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  case JCS_RGB:
  case JCS_YCbCr:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  case JCS_CMYK:
  case JCS_YCCK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  default:			/* JCS_UNKNOWN can be anything */
    if (cinfo->num_components < 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;
  }

  /* Set out_color_components and conversion method based on requested space.
   * Also clear the component_needed flags for any unused components,
   * so that earlier pipeline stages can avoid useless computation.
   */

  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    cinfo->out_color_components = 1;
    if (cinfo->jpeg_color_space == JCS_GRAYSCALE ||
	cinfo->jpeg_color_space == JCS_YCbCr) {
      cconvert->pub.color_convert = grayscale_convert;
      /* For color->grayscale conversion, only the Y (0) component is needed */
      for (ci = 1; ci < cinfo->num_components; ci++)
	cinfo->comp_info[ci].component_needed = FALSE;
    } else if (cinfo->jpeg_color_space == JCS_RGB) {
      cconvert->pub.color_convert = rgb_gray_convert;
      build_rgb_y_table(cinfo);
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_RGB:
    cinfo->out_color_components = RGB_PIXELSIZE;
    if (cinfo->jpeg_color_space == JCS_YCbCr) {
      cconvert->pub.color_convert = ycc_rgb_convert;
      build_ycc_rgb_table(cinfo);
    } else if (cinfo->jpeg_color_space == JCS_GRAYSCALE) {
      cconvert->pub.color_convert = gray_rgb_convert;
    } else if (cinfo->jpeg_color_space == JCS_RGB) {
      cconvert->pub.color_convert = rgb_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_CMYK:
    cinfo->out_color_components = 4;
    if (cinfo->jpeg_color_space == JCS_YCCK) {
      cconvert->pub.color_convert = ycck_cmyk_convert;
      build_ycc_rgb_table(cinfo);
    } else if (cinfo->jpeg_color_space == JCS_CMYK) {
      cconvert->pub.color_convert = null_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  default:
    /* Permit null conversion to same output space */
    if (cinfo->out_color_space == cinfo->jpeg_color_space) {
      cinfo->out_color_components = cinfo->num_components;
      cconvert->pub.color_convert = null_convert;
    } else			/* unsupported non-null conversion */
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;
  }

  if (cinfo->quantize_colors)
    cinfo->output_components = 1; /* single colormapped output component */
  else
    cinfo->output_components = cinfo->out_color_components;
}